

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int decode_one_ech_config
              (ptls_hpke_kem_t **kems,ptls_hpke_cipher_suite_t **ciphers,
              st_decoded_ech_config_t *decoded,uint8_t **src,uint8_t *end)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  uint8_t *puVar6;
  ptls_hpke_kem_t *ppVar7;
  ptls_hpke_cipher_suite_t *ppVar8;
  int iVar9;
  ushort *puVar10;
  char *name;
  byte *pbVar11;
  byte *pbVar12;
  ushort *puVar13;
  ulong uVar14;
  int iVar15;
  ptls_hpke_cipher_suite_t **pppVar16;
  
  (decoded->bytes).base = (uint8_t *)0x0;
  (decoded->bytes).len = 0;
  (decoded->public_name).base = (uint8_t *)0x0;
  (decoded->public_name).len = 0;
  decoded->cipher = (ptls_hpke_cipher_suite_t *)0x0;
  *(undefined8 *)&decoded->max_name_length = 0;
  (decoded->public_key).base = (uint8_t *)0x0;
  (decoded->public_key).len = 0;
  *(undefined8 *)decoded = 0;
  decoded->kem = (ptls_hpke_kem_t *)0x0;
  puVar6 = *src;
  iVar15 = 0x32;
  if (puVar6 != end) {
    *src = puVar6 + 1;
    decoded->id = *puVar6;
    puVar10 = (ushort *)*src;
    if (1 < (long)end - (long)puVar10) {
      uVar4 = *puVar10;
      puVar10 = puVar10 + 1;
      *src = (uint8_t *)puVar10;
      do {
        ppVar7 = *kems;
        if (ppVar7 == (ptls_hpke_kem_t *)0x0) goto LAB_0011a7c4;
        kems = kems + 1;
      } while (ppVar7->id != (uint16_t)(uVar4 << 8 | uVar4 >> 8));
      decoded->kem = ppVar7;
      puVar10 = (ushort *)*src;
LAB_0011a7c4:
      if (1 < (ulong)((long)end - (long)puVar10)) {
        *src = (byte *)((long)puVar10 + 1);
        uVar14 = (ulong)(byte)*puVar10 * 0x100;
        puVar13 = puVar10 + 1;
        *src = (uint8_t *)puVar13;
        if ((uVar14 + *(byte *)((long)puVar10 + 1)) - 1 < (ulong)((long)end - (long)puVar13)) {
          uVar14 = uVar14 | *(byte *)((long)puVar10 + 1);
          (decoded->public_key).base = (uint8_t *)puVar13;
          pbVar12 = (byte *)((long)puVar13 + uVar14);
          (decoded->public_key).len = uVar14;
          *src = pbVar12;
          if (1 < (ulong)((long)end - (long)pbVar12)) {
            *src = pbVar12 + 1;
            bVar2 = *pbVar12;
            puVar10 = (ushort *)(pbVar12 + 2);
            *src = (uint8_t *)puVar10;
            if ((ulong)CONCAT11(bVar2,pbVar12[1]) <= (ulong)((long)end - (long)puVar10)) {
              puVar13 = (ushort *)((ulong)CONCAT11(bVar2,pbVar12[1]) + (long)puVar10);
              name = (char *)0x0;
              do {
                if ((long)puVar13 - (long)puVar10 < 2) goto LAB_0011a842;
                uVar4 = *puVar10;
                *src = (uint8_t *)(puVar10 + 1);
                if ((long)puVar13 - (long)(puVar10 + 1) < 2) goto LAB_0011a842;
                uVar5 = puVar10[1];
                puVar10 = puVar10 + 2;
                *src = (uint8_t *)puVar10;
                if (decoded->cipher == (ptls_hpke_cipher_suite_t *)0x0) {
                  for (pppVar16 = ciphers; ppVar8 = *pppVar16,
                      ppVar8 != (ptls_hpke_cipher_suite_t *)0x0; pppVar16 = pppVar16 + 1) {
                    if (((ppVar8->id).kdf == (uint16_t)(uVar4 << 8 | uVar4 >> 8)) &&
                       ((ppVar8->id).aead == (uint16_t)(uVar5 << 8 | uVar5 >> 8))) {
                      decoded->cipher = ppVar8;
                      puVar10 = (ushort *)*src;
                      break;
                    }
                  }
                }
              } while (puVar10 != puVar13);
              if (puVar13 != (ushort *)end) {
                *src = (byte *)((long)puVar10 + 1);
                decoded->max_name_length = (byte)*puVar10;
                pbVar12 = *src;
                if (pbVar12 != end) {
                  pbVar11 = pbVar12 + 1;
                  *src = pbVar11;
                  uVar14 = (ulong)*pbVar12;
                  if ((uVar14 <= (ulong)((long)end - (long)pbVar11)) && (uVar14 != 0)) {
                    name = duplicate_as_str(pbVar11,uVar14);
                    if (name != (char *)0x0) {
                      pbVar11 = pbVar11 + uVar14;
                      iVar9 = ptls_server_name_is_ipaddr(name);
                      if (iVar9 == 0) {
                        puVar6 = *src;
                        (decoded->public_name).base = puVar6;
                        (decoded->public_name).len = (long)pbVar11 - (long)puVar6;
                      }
                      else {
                        decoded->kem = (ptls_hpke_kem_t *)0x0;
                        decoded->cipher = (ptls_hpke_cipher_suite_t *)0x0;
                      }
                      *src = pbVar11;
                      if (1 < (ulong)((long)end - (long)pbVar11)) {
                        *src = pbVar11 + 1;
                        bVar2 = *pbVar11;
                        pbVar12 = pbVar11 + 2;
                        *src = pbVar12;
                        if ((ulong)CONCAT11(bVar2,pbVar11[1]) <= (ulong)((long)end - (long)pbVar12))
                        {
                          pbVar11 = pbVar12 + CONCAT11(bVar2,pbVar11[1]);
                          while (pbVar12 < pbVar11) {
                            if ((long)pbVar11 - (long)pbVar12 < 2) goto LAB_0011a842;
                            bVar2 = *pbVar12;
                            *src = pbVar12 + 2;
                            if ((ulong)((long)pbVar11 - (long)(pbVar12 + 2)) < 2) goto LAB_0011a842;
                            *src = pbVar12 + 3;
                            bVar3 = pbVar12[2];
                            pbVar1 = pbVar12 + 4;
                            *src = pbVar1;
                            if ((ulong)((long)pbVar11 - (long)pbVar1) <
                                (ulong)CONCAT11(bVar3,pbVar12[3])) goto LAB_0011a842;
                            pbVar12 = pbVar1 + CONCAT11(bVar3,pbVar12[3]);
                            *src = pbVar12;
                            if ((char)bVar2 < '\0') {
                              decoded->kem = (ptls_hpke_kem_t *)0x0;
                              decoded->cipher = (ptls_hpke_cipher_suite_t *)0x0;
                              pbVar12 = *src;
                            }
                          }
                          if ((pbVar12 == pbVar11) && (iVar15 = 0x32, pbVar11 == end)) {
                            iVar15 = 0;
                          }
                        }
                      }
                      goto LAB_0011a842;
                    }
                    iVar15 = 0x201;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  name = (char *)0x0;
LAB_0011a842:
  free(name);
  return iVar15;
}

Assistant:

static int decode_one_ech_config(ptls_hpke_kem_t **kems, ptls_hpke_cipher_suite_t **ciphers,
                                 struct st_decoded_ech_config_t *decoded, const uint8_t **src, const uint8_t *const end)
{
    char *public_name_buf = NULL;
    int ret;

    *decoded = (struct st_decoded_ech_config_t){0};

    if ((ret = ptls_decode8(&decoded->id, src, end)) != 0)
        goto Exit;
    uint16_t kem_id;
    if ((ret = ptls_decode16(&kem_id, src, end)) != 0)
        goto Exit;
    for (size_t i = 0; kems[i] != NULL; ++i) {
        if (kems[i]->id == kem_id) {
            decoded->kem = kems[i];
            break;
        }
    }
    ptls_decode_open_block(*src, end, 2, {
        if (*src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        decoded->public_key = ptls_iovec_init(*src, end - *src);
        *src = end;
    });
    ptls_decode_open_block(*src, end, 2, {
        do {
            uint16_t kdf_id;
            uint16_t aead_id;
            if ((ret = ptls_decode16(&kdf_id, src, end)) != 0)
                goto Exit;
            if ((ret = ptls_decode16(&aead_id, src, end)) != 0)
                goto Exit;
            if (decoded->cipher == NULL) {
                for (size_t i = 0; ciphers[i] != NULL; ++i) {
                    if (ciphers[i]->id.kdf == kdf_id && ciphers[i]->id.aead == aead_id) {
                        decoded->cipher = ciphers[i];
                        break;
                    }
                }
            }
        } while (*src != end);
    });
    if ((ret = ptls_decode8(&decoded->max_name_length, src, end)) != 0)
        goto Exit;

#define SKIP_DECODED()                                                                                                             \
    do {                                                                                                                           \
        decoded->kem = NULL;                                                                                                       \
        decoded->cipher = NULL;                                                                                                    \
    } while (0)

    /* Decode public_name. The specification requires clients to ignore (upon parsing ESNIConfigList) or reject (upon handshake)
     * public names that are not DNS names or IPv4 addresses. We ignore IPv4 and v6 addresses during parsing (IPv6 addresses never
     * looks like DNS names), and delegate the responsibility of rejecting non-DNS names to the certificate verify callback. */
    ptls_decode_open_block(*src, end, 1, {
        if (*src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        if ((public_name_buf = duplicate_as_str(*src, end - *src)) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        if (ptls_server_name_is_ipaddr(public_name_buf)) {
            SKIP_DECODED();
        } else {
            decoded->public_name = ptls_iovec_init(*src, end - *src);
        }
        *src = end;
    });

    ptls_decode_block(*src, end, 2, {
        while (*src < end) {
            uint16_t type;
            if ((ret = ptls_decode16(&type, src, end)) != 0)
                goto Exit;
            ptls_decode_open_block(*src, end, 2, { *src = end; });
            /* if a critital extension is found, indicate that the config cannot be used */
            if ((type & 0x8000) != 0)
                SKIP_DECODED();
        }
    });

#undef SKIP_DECODED

Exit:
    free(public_name_buf);
    return ret;
}